

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O3

string_t __thiscall
duckdb::HugeintCastToVarInt::Operation<duckdb::uhugeint_t>
          (HugeintCastToVarInt *this,uhugeint_t int_value,Vector *result)

{
  HugeintCastToVarInt *pHVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  StringVector *this_00;
  StringVector *extraout_RDX;
  StringVector *extraout_RDX_00;
  StringVector *pSVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *blob_00;
  double dVar10;
  ulong uVar11;
  long lVar13;
  undefined1 auVar12 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar83;
  undefined1 auVar70 [16];
  int iVar84;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  long lVar85;
  long lVar100;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  long lVar101;
  long lVar105;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  string_t sVar106;
  string_t blob;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long local_48;
  long lStack_40;
  
  this_00 = (StringVector *)int_value.upper;
  uVar8 = int_value.lower;
  pSVar5 = this_00;
  if (uVar8 == 0xffffffffffffffff) {
    uVar7 = 8;
LAB_007eb1ef:
    iVar83 = (int)uVar7 + 8;
  }
  else {
    if (uVar8 != 0) {
      lVar85 = uVar8 + 1;
      auVar38._8_4_ = (int)((ulong)lVar85 >> 0x20);
      auVar38._0_8_ = lVar85;
      auVar38._12_4_ = 0x45300000;
      in_XMM1._0_8_ = (double)CONCAT44(0x43300000,(int)lVar85) - 4503599627370496.0;
      in_XMM1._8_8_ = auVar38._8_8_ - 1.9342813113834067e+25;
      dVar10 = log2(in_XMM1._8_8_ + in_XMM1._0_8_);
      dVar10 = ceil(dVar10 * 0.125);
      uVar7 = (ulong)dVar10;
      pSVar5 = extraout_RDX;
      if ((int)uVar7 != 0) goto LAB_007eb1ef;
    }
    uVar7 = 0;
    if (this == (HugeintCastToVarInt *)0xffffffffffffffff) {
      iVar83 = 8;
    }
    else {
      pHVar1 = this + 1;
      auVar41._8_4_ = (int)((ulong)pHVar1 >> 0x20);
      auVar41._0_8_ = pHVar1;
      auVar41._12_4_ = 0x45300000;
      in_XMM1._0_8_ = (double)CONCAT44(0x43300000,(int)pHVar1) - 4503599627370496.0;
      in_XMM1._8_8_ = auVar41._8_8_ - 1.9342813113834067e+25;
      dVar10 = log2(in_XMM1._8_8_ + in_XMM1._0_8_);
      dVar10 = ceil(dVar10 * 0.125);
      iVar83 = (int)(long)dVar10;
      pSVar5 = extraout_RDX_00;
    }
  }
  uVar9 = iVar83 + (uint)(iVar83 == 0);
  local_68 = (undefined1  [16])
             StringVector::EmptyString(this_00,(Vector *)(ulong)(uVar9 + 3),(idx_t)pSVar5);
  blob_00 = local_68._8_8_;
  if (local_68._0_4_ < 0xd) {
    blob_00 = local_68 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar9,false);
  uVar6 = (uint)uVar7;
  if ((int)uVar6 < 1) {
    uVar3 = 3;
  }
  else {
    uVar3 = (ulong)(uVar6 + 3);
    lVar4 = (uVar7 & 0xffffffff) - 1;
    uVar11 = uVar7 & 0xffffffff;
    lVar85 = uVar11 - 0xe;
    uVar7 = uVar7 & 0xffffffff;
    lVar100 = uVar7 - 0xf;
    in_XMM2._0_8_ = uVar11 - 0xc;
    in_XMM2._8_8_ = uVar7 - 0xd;
    lVar30 = uVar11 - 10;
    lVar31 = uVar7 - 0xb;
    lVar32 = uVar11 - 8;
    lVar33 = uVar7 - 9;
    lVar34 = uVar11 - 6;
    lVar35 = uVar7 - 7;
    lVar36 = uVar11 - 4;
    lVar37 = uVar7 - 5;
    lVar101 = uVar11 - 2;
    lVar105 = uVar7 - 3;
    lVar13 = uVar7 - 1;
    local_58._8_4_ = (int)lVar4;
    local_58._0_8_ = lVar4;
    local_58._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar7 = 0;
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    do {
      auVar70._8_4_ = (int)uVar7;
      auVar70._0_8_ = uVar7;
      auVar70._12_4_ = (int)(uVar7 >> 0x20);
      auVar41 = local_58 ^ _DAT_012acff0;
      auVar38 = (auVar70 | _DAT_012acfe0) ^ _DAT_012acff0;
      iVar83 = auVar41._0_4_;
      iVar45 = -(uint)(iVar83 < auVar38._0_4_);
      iVar84 = auVar41._4_4_;
      iVar56 = -(uint)(iVar84 < auVar38._4_4_);
      iVar43 = auVar41._8_4_;
      iVar57 = -(uint)(iVar43 < auVar38._8_4_);
      iVar44 = auVar41._12_4_;
      iVar58 = -(uint)(iVar44 < auVar38._12_4_);
      auVar86._4_4_ = iVar45;
      auVar86._0_4_ = iVar45;
      auVar86._8_4_ = iVar57;
      auVar86._12_4_ = iVar57;
      auVar65 = pshuflw(in_XMM12,auVar86,0xe8);
      auVar46._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar46._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar46._0_4_ = auVar46._4_4_;
      auVar46._8_4_ = auVar46._12_4_;
      auVar41 = pshuflw(in_XMM10,auVar46,0xe8);
      auVar39._4_4_ = iVar56;
      auVar39._0_4_ = iVar56;
      auVar39._8_4_ = iVar58;
      auVar39._12_4_ = iVar58;
      auVar38 = pshuflw(_DAT_012acff0,auVar39,0xe8);
      auVar38 = (auVar38 | auVar41 & auVar65) ^ auVar23;
      auVar38 = packssdw(auVar38,auVar38);
      lVar4 = auVar23._8_8_;
      local_48 = lVar85;
      lStack_40 = lVar100;
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 3] = (char)(uVar8 >> (((char)uVar11 + -1) * '\b' & 0x3fU));
      }
      auVar39 = auVar46 & auVar86 | auVar39;
      auVar38 = packssdw(auVar39,auVar39);
      auVar38 = packssdw(auVar38 ^ auVar23,auVar38 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 4] = (char)(uVar8 >> ((byte)((int)(lVar13 + lVar4) << 3) & 0x3f));
      }
      auVar38 = (auVar70 | _DAT_0132e0c0) ^ _DAT_012acff0;
      iVar45 = -(uint)(iVar83 < auVar38._0_4_);
      iVar57 = -(uint)(iVar84 < auVar38._4_4_);
      iVar56 = -(uint)(iVar43 < auVar38._8_4_);
      iVar58 = -(uint)(iVar44 < auVar38._12_4_);
      auVar65._4_4_ = iVar45;
      auVar65._0_4_ = iVar45;
      auVar65._8_4_ = iVar56;
      auVar65._12_4_ = iVar56;
      iVar45 = -(uint)(auVar38._4_4_ == iVar84);
      iVar56 = -(uint)(auVar38._12_4_ == iVar44);
      auVar87._4_4_ = iVar45;
      auVar87._0_4_ = iVar45;
      auVar87._8_4_ = iVar56;
      auVar87._12_4_ = iVar56;
      auVar66._4_4_ = iVar57;
      auVar66._0_4_ = iVar57;
      auVar66._8_4_ = iVar58;
      auVar66._12_4_ = iVar58;
      auVar38 = auVar87 & auVar65 | auVar66;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packssdw(auVar38 ^ auVar23,auVar38 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar7 + 5] = (char)(uVar8 >> (((char)lVar101 + -1) * '\b' & 0x3fU));
      }
      auVar38 = pshufhw(auVar38,auVar65,0x84);
      auVar46 = pshufhw(auVar65,auVar87,0x84);
      auVar41 = pshufhw(auVar38,auVar66,0x84);
      auVar38 = (auVar41 | auVar46 & auVar38) ^ auVar23;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar7 + 6] = (char)(uVar8 >> ((byte)((int)(lVar105 + lVar4) << 3) & 0x3f));
      }
      auVar38 = (auVar70 | _DAT_0132e0f0) ^ _DAT_012acff0;
      auVar59._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar59._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar59._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar59._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar88._4_4_ = auVar59._0_4_;
      auVar88._0_4_ = auVar59._0_4_;
      auVar88._8_4_ = auVar59._8_4_;
      auVar88._12_4_ = auVar59._8_4_;
      auVar46 = pshuflw(auVar66,auVar88,0xe8);
      auVar14._0_4_ = -(uint)(auVar38._0_4_ == iVar83);
      auVar14._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar14._8_4_ = -(uint)(auVar38._8_4_ == iVar43);
      auVar14._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar47._4_4_ = auVar14._4_4_;
      auVar47._0_4_ = auVar14._4_4_;
      auVar47._8_4_ = auVar14._12_4_;
      auVar47._12_4_ = auVar14._12_4_;
      auVar38 = pshuflw(auVar14,auVar47,0xe8);
      auVar48._4_4_ = auVar59._4_4_;
      auVar48._0_4_ = auVar59._4_4_;
      auVar48._8_4_ = auVar59._12_4_;
      auVar48._12_4_ = auVar59._12_4_;
      auVar41 = pshuflw(auVar59,auVar48,0xe8);
      auVar38 = packssdw(auVar38 & auVar46,(auVar41 | auVar38 & auVar46) ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 7] = (char)(uVar8 >> (((char)lVar36 + -1) * '\b' & 0x3fU));
      }
      auVar48 = auVar47 & auVar88 | auVar48;
      auVar41 = packssdw(auVar48,auVar48);
      auVar38 = packssdw(auVar38,auVar41 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 8] = (char)(uVar8 >> ((byte)((int)(lVar37 + lVar4) << 3) & 0x3f));
      }
      auVar38 = (auVar70 | _DAT_0132e0e0) ^ _DAT_012acff0;
      iVar45 = -(uint)(iVar83 < auVar38._0_4_);
      iVar57 = -(uint)(iVar84 < auVar38._4_4_);
      iVar56 = -(uint)(iVar43 < auVar38._8_4_);
      iVar58 = -(uint)(iVar44 < auVar38._12_4_);
      auVar49._4_4_ = iVar45;
      auVar49._0_4_ = iVar45;
      auVar49._8_4_ = iVar56;
      auVar49._12_4_ = iVar56;
      iVar45 = -(uint)(auVar38._4_4_ == iVar84);
      iVar56 = -(uint)(auVar38._12_4_ == iVar44);
      auVar67._4_4_ = iVar45;
      auVar67._0_4_ = iVar45;
      auVar67._8_4_ = iVar56;
      auVar67._12_4_ = iVar56;
      auVar89._4_4_ = iVar57;
      auVar89._0_4_ = iVar57;
      auVar89._8_4_ = iVar58;
      auVar89._12_4_ = iVar58;
      auVar38 = auVar67 & auVar49 | auVar89;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packssdw(auVar38 ^ auVar23,auVar38 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 9] = (char)(uVar8 >> (((char)lVar34 + -1) * '\b' & 0x3fU));
      }
      auVar38 = pshufhw(auVar38,auVar49,0x84);
      auVar46 = pshufhw(auVar49,auVar67,0x84);
      auVar41 = pshufhw(auVar38,auVar89,0x84);
      auVar38 = (auVar41 | auVar46 & auVar38) ^ auVar23;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 10] = (char)(uVar8 >> ((byte)((int)(lVar35 + lVar4) << 3) & 0x3f));
      }
      auVar38 = (auVar70 | _DAT_0134e250) ^ _DAT_012acff0;
      auVar60._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar60._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar60._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar60._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar90._4_4_ = auVar60._0_4_;
      auVar90._0_4_ = auVar60._0_4_;
      auVar90._8_4_ = auVar60._8_4_;
      auVar90._12_4_ = auVar60._8_4_;
      auVar46 = pshuflw(auVar67,auVar90,0xe8);
      auVar15._0_4_ = -(uint)(auVar38._0_4_ == iVar83);
      auVar15._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar15._8_4_ = -(uint)(auVar38._8_4_ == iVar43);
      auVar15._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar50._4_4_ = auVar15._4_4_;
      auVar50._0_4_ = auVar15._4_4_;
      auVar50._8_4_ = auVar15._12_4_;
      auVar50._12_4_ = auVar15._12_4_;
      auVar38 = pshuflw(auVar15,auVar50,0xe8);
      auVar51._4_4_ = auVar60._4_4_;
      auVar51._0_4_ = auVar60._4_4_;
      auVar51._8_4_ = auVar60._12_4_;
      auVar51._12_4_ = auVar60._12_4_;
      auVar41 = pshuflw(auVar60,auVar51,0xe8);
      auVar41 = (auVar41 | auVar38 & auVar46) ^ auVar23;
      auVar41 = packssdw(auVar41,auVar41);
      auVar38 = packsswb(auVar38 & auVar46,auVar41);
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 0xb] = (char)(uVar8 >> (((char)lVar32 + -1) * '\b' & 0x3fU));
      }
      auVar51 = auVar50 & auVar90 | auVar51;
      auVar41 = packssdw(auVar51,auVar51);
      auVar41 = packssdw(auVar41 ^ auVar23,auVar41 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar41);
      if ((auVar38._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 0xc] = (char)(uVar8 >> ((byte)((int)(lVar33 + lVar4) << 3) & 0x3f));
      }
      auVar38 = (auVar70 | _DAT_0134e240) ^ _DAT_012acff0;
      iVar45 = -(uint)(iVar83 < auVar38._0_4_);
      iVar57 = -(uint)(iVar84 < auVar38._4_4_);
      iVar56 = -(uint)(iVar43 < auVar38._8_4_);
      iVar58 = -(uint)(iVar44 < auVar38._12_4_);
      auVar52._4_4_ = iVar45;
      auVar52._0_4_ = iVar45;
      auVar52._8_4_ = iVar56;
      auVar52._12_4_ = iVar56;
      iVar45 = -(uint)(auVar38._4_4_ == iVar84);
      iVar56 = -(uint)(auVar38._12_4_ == iVar44);
      auVar68._4_4_ = iVar45;
      auVar68._0_4_ = iVar45;
      auVar68._8_4_ = iVar56;
      auVar68._12_4_ = iVar56;
      auVar91._4_4_ = iVar57;
      auVar91._0_4_ = iVar57;
      auVar91._8_4_ = iVar58;
      auVar91._12_4_ = iVar58;
      auVar38 = auVar68 & auVar52 | auVar91;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packssdw(auVar38 ^ auVar23,auVar38 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 0xd] = (char)(uVar8 >> (((char)lVar30 + -1) * '\b' & 0x3fU));
      }
      auVar38 = pshufhw(auVar38,auVar52,0x84);
      auVar46 = pshufhw(auVar52,auVar68,0x84);
      auVar41 = pshufhw(auVar38,auVar91,0x84);
      auVar38 = (auVar41 | auVar46 & auVar38) ^ auVar23;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 0xe] = (char)(uVar8 >> ((byte)((int)(lVar31 + lVar4) << 3) & 0x3f));
      }
      lVar40 = in_XMM2._8_8_;
      auVar38 = (auVar70 | _DAT_0134e230) ^ _DAT_012acff0;
      auVar61._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar61._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar61._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar61._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar92._4_4_ = auVar61._0_4_;
      auVar92._0_4_ = auVar61._0_4_;
      auVar92._8_4_ = auVar61._8_4_;
      auVar92._12_4_ = auVar61._8_4_;
      auVar46 = pshuflw(auVar68,auVar92,0xe8);
      auVar16._0_4_ = -(uint)(auVar38._0_4_ == iVar83);
      auVar16._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar16._8_4_ = -(uint)(auVar38._8_4_ == iVar43);
      auVar16._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar53._4_4_ = auVar16._4_4_;
      auVar53._0_4_ = auVar16._4_4_;
      auVar53._8_4_ = auVar16._12_4_;
      auVar53._12_4_ = auVar16._12_4_;
      auVar38 = pshuflw(auVar16,auVar53,0xe8);
      auVar54._4_4_ = auVar61._4_4_;
      auVar54._0_4_ = auVar61._4_4_;
      auVar54._8_4_ = auVar61._12_4_;
      auVar54._12_4_ = auVar61._12_4_;
      auVar41 = pshuflw(auVar61,auVar54,0xe8);
      auVar38 = packssdw(auVar38 & auVar46,(auVar41 | auVar38 & auVar46) ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 0xf] = (char)(uVar8 >> ((in_XMM2[0] + -1) * '\b' & 0x3fU));
      }
      auVar54 = auVar53 & auVar92 | auVar54;
      auVar41 = packssdw(auVar54,auVar54);
      auVar38 = packssdw(auVar38,auVar41 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 0x10] = (char)(uVar8 >> ((byte)((int)(lVar40 + lVar4) << 3) & 0x3f));
      }
      lVar100 = lStack_40;
      lVar85 = local_48;
      lVar4 = lStack_40 + lVar4;
      auVar38 = (auVar70 | _DAT_0134e220) ^ _DAT_012acff0;
      auVar17._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar17._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar17._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar17._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar55._4_4_ = auVar17._0_4_;
      auVar55._0_4_ = auVar17._0_4_;
      auVar55._8_4_ = auVar17._8_4_;
      auVar55._12_4_ = auVar17._8_4_;
      iVar83 = -(uint)(auVar38._4_4_ == iVar84);
      iVar84 = -(uint)(auVar38._12_4_ == iVar44);
      auVar42._4_4_ = iVar83;
      auVar42._0_4_ = iVar83;
      auVar42._8_4_ = iVar84;
      auVar42._12_4_ = iVar84;
      in_XMM12._4_4_ = auVar17._4_4_;
      in_XMM12._0_4_ = auVar17._4_4_;
      in_XMM12._8_4_ = auVar17._12_4_;
      in_XMM12._12_4_ = auVar17._12_4_;
      in_XMM10 = auVar42 & auVar55 | in_XMM12;
      auVar38 = packssdw(auVar17,in_XMM10);
      auVar38 = packssdw(auVar38 ^ auVar23,auVar38 ^ auVar23);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar7 + 0x11] = (char)(uVar8 >> (((char)local_48 + -1) * '\b' & 0x3fU));
      }
      auVar38 = pshufhw(auVar38,auVar55,0x84);
      auVar46 = pshufhw(auVar42,auVar42,0x84);
      auVar41 = pshufhw(auVar38,in_XMM12,0x84);
      auVar38 = (auVar41 | auVar46 & auVar38) ^ auVar23;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar7 + 0x12] = (char)(uVar8 >> ((byte)((int)lVar4 << 3) & 0x3f));
      }
      uVar7 = uVar7 + 0x10;
      lVar4 = (long)DAT_0136c0d0;
      uVar11 = uVar11 + lVar4;
      lVar22 = DAT_0136c0d0._8_8_;
      lVar13 = lVar13 + lVar22;
      lVar101 = lVar101 + lVar4;
      lVar105 = lVar105 + lVar22;
      lVar36 = lVar36 + lVar4;
      lVar37 = lVar37 + lVar22;
      lVar34 = lVar34 + lVar4;
      lVar35 = lVar35 + lVar22;
      lVar32 = lVar32 + lVar4;
      lVar33 = lVar33 + lVar22;
      lVar30 = lVar30 + lVar4;
      lVar31 = lVar31 + lVar22;
      in_XMM2._0_8_ = in_XMM2._0_8_ + lVar4;
      in_XMM2._8_8_ = lVar40 + lVar22;
      lVar85 = lVar85 + lVar4;
      lVar100 = lVar100 + lVar22;
      in_XMM1 = _DAT_0136c0d0;
    } while ((uVar6 + 0xf & 0xfffffff0) != uVar7);
  }
  if (-1 < (int)(~uVar6 + uVar9)) {
    lVar85 = (ulong)(uVar9 - uVar6) - 1;
    auVar12._8_4_ = (int)lVar85;
    auVar12._0_8_ = lVar85;
    auVar12._12_4_ = (int)((ulong)lVar85 >> 0x20);
    lVar85 = (ulong)(~uVar6 + uVar9) << 3;
    uVar8 = 0;
    auVar62._8_4_ = 0xffffffff;
    auVar62._0_8_ = 0xffffffffffffffff;
    auVar62._12_4_ = 0xffffffff;
    do {
      auVar63._8_4_ = (int)uVar8;
      auVar63._0_8_ = uVar8;
      auVar63._12_4_ = (int)(uVar8 >> 0x20);
      auVar38 = auVar12 ^ _DAT_012acff0;
      auVar41 = (auVar63 | _DAT_012acfe0) ^ _DAT_012acff0;
      iVar83 = auVar38._0_4_;
      iVar45 = -(uint)(iVar83 < auVar41._0_4_);
      iVar84 = auVar38._4_4_;
      auVar72._4_4_ = -(uint)(iVar84 < auVar41._4_4_);
      iVar43 = auVar38._8_4_;
      iVar56 = -(uint)(iVar43 < auVar41._8_4_);
      iVar44 = auVar38._12_4_;
      auVar72._12_4_ = -(uint)(iVar44 < auVar41._12_4_);
      auVar93._4_4_ = iVar45;
      auVar93._0_4_ = iVar45;
      auVar93._8_4_ = iVar56;
      auVar93._12_4_ = iVar56;
      auVar38 = pshuflw(in_XMM1,auVar93,0xe8);
      auVar71._4_4_ = -(uint)(auVar41._4_4_ == iVar84);
      auVar71._12_4_ = -(uint)(auVar41._12_4_ == iVar44);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar23 = pshuflw(in_XMM2,auVar71,0xe8);
      auVar72._0_4_ = auVar72._4_4_;
      auVar72._8_4_ = auVar72._12_4_;
      auVar41 = pshuflw(auVar38,auVar72,0xe8);
      auVar38 = (auVar41 | auVar23 & auVar38) ^ auVar62;
      auVar38 = packssdw(auVar38,auVar38);
      bVar2 = (byte)lVar85;
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3] = (char)((ulong)this >> (bVar2 & 0x38));
      }
      auVar72 = auVar71 & auVar93 | auVar72;
      auVar38 = packssdw(auVar72,auVar72);
      auVar38 = packssdw(auVar38 ^ auVar62,auVar38 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 1] = (char)((ulong)this >> (bVar2 - 8 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0132e0c0) ^ _DAT_012acff0;
      auVar24._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar24._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar24._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar24._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar73._4_4_ = auVar24._0_4_;
      auVar73._0_4_ = auVar24._0_4_;
      auVar73._8_4_ = auVar24._8_4_;
      auVar73._12_4_ = auVar24._8_4_;
      iVar45 = -(uint)(auVar38._4_4_ == iVar84);
      iVar56 = -(uint)(auVar38._12_4_ == iVar44);
      auVar94._4_4_ = iVar45;
      auVar94._0_4_ = iVar45;
      auVar94._8_4_ = iVar56;
      auVar94._12_4_ = iVar56;
      auVar102._4_4_ = auVar24._4_4_;
      auVar102._0_4_ = auVar24._4_4_;
      auVar102._8_4_ = auVar24._12_4_;
      auVar102._12_4_ = auVar24._12_4_;
      auVar38 = auVar94 & auVar73 | auVar102;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packssdw(auVar38 ^ auVar62,auVar38 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 2] = (char)((ulong)this >> (bVar2 - 0x10 & 0x38));
      }
      auVar38 = pshufhw(auVar38,auVar73,0x84);
      auVar23 = pshufhw(auVar24,auVar94,0x84);
      auVar41 = pshufhw(auVar38,auVar102,0x84);
      auVar38 = (auVar41 | auVar23 & auVar38) ^ auVar62;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 3] = (char)((ulong)this >> (bVar2 - 0x18 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0132e0f0) ^ _DAT_012acff0;
      auVar25._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar25._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar25._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar25._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar95._4_4_ = auVar25._0_4_;
      auVar95._0_4_ = auVar25._0_4_;
      auVar95._8_4_ = auVar25._8_4_;
      auVar95._12_4_ = auVar25._8_4_;
      auVar23 = pshuflw(auVar102,auVar95,0xe8);
      auVar18._0_4_ = -(uint)(auVar38._0_4_ == iVar83);
      auVar18._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar18._8_4_ = -(uint)(auVar38._8_4_ == iVar43);
      auVar18._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar74._4_4_ = auVar18._4_4_;
      auVar74._0_4_ = auVar18._4_4_;
      auVar74._8_4_ = auVar18._12_4_;
      auVar74._12_4_ = auVar18._12_4_;
      auVar38 = pshuflw(auVar18,auVar74,0xe8);
      auVar75._4_4_ = auVar25._4_4_;
      auVar75._0_4_ = auVar25._4_4_;
      auVar75._8_4_ = auVar25._12_4_;
      auVar75._12_4_ = auVar25._12_4_;
      auVar41 = pshuflw(auVar25,auVar75,0xe8);
      auVar38 = packssdw(auVar38 & auVar23,(auVar41 | auVar38 & auVar23) ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3 + 4] = (char)((ulong)this >> (bVar2 - 0x20 & 0x38));
      }
      auVar75 = auVar74 & auVar95 | auVar75;
      auVar41 = packssdw(auVar75,auVar75);
      auVar38 = packssdw(auVar38,auVar41 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 5] = (char)((ulong)this >> (bVar2 - 0x28 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0132e0e0) ^ _DAT_012acff0;
      auVar26._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar26._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar26._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar26._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar76._4_4_ = auVar26._0_4_;
      auVar76._0_4_ = auVar26._0_4_;
      auVar76._8_4_ = auVar26._8_4_;
      auVar76._12_4_ = auVar26._8_4_;
      iVar45 = -(uint)(auVar38._4_4_ == iVar84);
      iVar56 = -(uint)(auVar38._12_4_ == iVar44);
      auVar96._4_4_ = iVar45;
      auVar96._0_4_ = iVar45;
      auVar96._8_4_ = iVar56;
      auVar96._12_4_ = iVar56;
      auVar103._4_4_ = auVar26._4_4_;
      auVar103._0_4_ = auVar26._4_4_;
      auVar103._8_4_ = auVar26._12_4_;
      auVar103._12_4_ = auVar26._12_4_;
      auVar38 = auVar96 & auVar76 | auVar103;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packssdw(auVar38 ^ auVar62,auVar38 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3 + 6] = (char)((ulong)this >> (bVar2 - 0x30 & 0x38));
      }
      auVar38 = pshufhw(auVar38,auVar76,0x84);
      auVar23 = pshufhw(auVar26,auVar96,0x84);
      auVar41 = pshufhw(auVar38,auVar103,0x84);
      auVar38 = (auVar41 | auVar23 & auVar38) ^ auVar62;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 7] = (char)((ulong)this >> (bVar2 - 0x38 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0134e250) ^ _DAT_012acff0;
      auVar27._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar27._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar27._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar27._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar97._4_4_ = auVar27._0_4_;
      auVar97._0_4_ = auVar27._0_4_;
      auVar97._8_4_ = auVar27._8_4_;
      auVar97._12_4_ = auVar27._8_4_;
      auVar23 = pshuflw(auVar103,auVar97,0xe8);
      auVar19._0_4_ = -(uint)(auVar38._0_4_ == iVar83);
      auVar19._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar19._8_4_ = -(uint)(auVar38._8_4_ == iVar43);
      auVar19._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar77._4_4_ = auVar19._4_4_;
      auVar77._0_4_ = auVar19._4_4_;
      auVar77._8_4_ = auVar19._12_4_;
      auVar77._12_4_ = auVar19._12_4_;
      auVar38 = pshuflw(auVar19,auVar77,0xe8);
      auVar78._4_4_ = auVar27._4_4_;
      auVar78._0_4_ = auVar27._4_4_;
      auVar78._8_4_ = auVar27._12_4_;
      auVar78._12_4_ = auVar27._12_4_;
      auVar41 = pshuflw(auVar27,auVar78,0xe8);
      auVar41 = (auVar41 | auVar38 & auVar23) ^ auVar62;
      auVar41 = packssdw(auVar41,auVar41);
      auVar38 = packsswb(auVar38 & auVar23,auVar41);
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3 + 8] = (char)((ulong)this >> (bVar2 - 0x40 & 0x38));
      }
      auVar78 = auVar77 & auVar97 | auVar78;
      auVar41 = packssdw(auVar78,auVar78);
      auVar41 = packssdw(auVar41 ^ auVar62,auVar41 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar41);
      if ((auVar38._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 9] = (char)((ulong)this >> (bVar2 + 0xb8 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0134e240) ^ _DAT_012acff0;
      auVar28._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar28._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar28._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar28._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar79._4_4_ = auVar28._0_4_;
      auVar79._0_4_ = auVar28._0_4_;
      auVar79._8_4_ = auVar28._8_4_;
      auVar79._12_4_ = auVar28._8_4_;
      iVar45 = -(uint)(auVar38._4_4_ == iVar84);
      iVar56 = -(uint)(auVar38._12_4_ == iVar44);
      auVar98._4_4_ = iVar45;
      auVar98._0_4_ = iVar45;
      auVar98._8_4_ = iVar56;
      auVar98._12_4_ = iVar56;
      auVar104._4_4_ = auVar28._4_4_;
      auVar104._0_4_ = auVar28._4_4_;
      auVar104._8_4_ = auVar28._12_4_;
      auVar104._12_4_ = auVar28._12_4_;
      auVar38 = auVar98 & auVar79 | auVar104;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packssdw(auVar38 ^ auVar62,auVar38 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3 + 10] = (char)((ulong)this >> (bVar2 + 0xb0 & 0x38));
      }
      auVar38 = pshufhw(auVar38,auVar79,0x84);
      auVar23 = pshufhw(auVar28,auVar98,0x84);
      auVar41 = pshufhw(auVar38,auVar104,0x84);
      auVar38 = (auVar41 | auVar23 & auVar38) ^ auVar62;
      auVar38 = packssdw(auVar38,auVar38);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 0xb] = (char)((ulong)this >> (bVar2 + 0xa8 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0134e230) ^ _DAT_012acff0;
      auVar29._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar29._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar29._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar29._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar99._4_4_ = auVar29._0_4_;
      auVar99._0_4_ = auVar29._0_4_;
      auVar99._8_4_ = auVar29._8_4_;
      auVar99._12_4_ = auVar29._8_4_;
      auVar23 = pshuflw(auVar104,auVar99,0xe8);
      auVar20._0_4_ = -(uint)(auVar38._0_4_ == iVar83);
      auVar20._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar20._8_4_ = -(uint)(auVar38._8_4_ == iVar43);
      auVar20._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar80._4_4_ = auVar20._4_4_;
      auVar80._0_4_ = auVar20._4_4_;
      auVar80._8_4_ = auVar20._12_4_;
      auVar80._12_4_ = auVar20._12_4_;
      auVar38 = pshuflw(auVar20,auVar80,0xe8);
      auVar81._4_4_ = auVar29._4_4_;
      auVar81._0_4_ = auVar29._4_4_;
      auVar81._8_4_ = auVar29._12_4_;
      auVar81._12_4_ = auVar29._12_4_;
      auVar41 = pshuflw(auVar29,auVar81,0xe8);
      auVar38 = packssdw(auVar38 & auVar23,(auVar41 | auVar38 & auVar23) ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3 + 0xc] = (char)((ulong)this >> (bVar2 + 0xa0 & 0x38));
      }
      auVar81 = auVar80 & auVar99 | auVar81;
      auVar41 = packssdw(auVar81,auVar81);
      auVar38 = packssdw(auVar38,auVar41 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 0xd] = (char)((ulong)this >> (bVar2 + 0x98 & 0x38));
      }
      auVar38 = (auVar63 | _DAT_0134e220) ^ _DAT_012acff0;
      auVar21._0_4_ = -(uint)(iVar83 < auVar38._0_4_);
      auVar21._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
      auVar21._8_4_ = -(uint)(iVar43 < auVar38._8_4_);
      auVar21._12_4_ = -(uint)(iVar44 < auVar38._12_4_);
      auVar82._4_4_ = auVar21._0_4_;
      auVar82._0_4_ = auVar21._0_4_;
      auVar82._8_4_ = auVar21._8_4_;
      auVar82._12_4_ = auVar21._8_4_;
      auVar64._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
      auVar64._12_4_ = -(uint)(auVar38._12_4_ == iVar44);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar69._4_4_ = auVar21._4_4_;
      auVar69._0_4_ = auVar21._4_4_;
      auVar69._8_4_ = auVar21._12_4_;
      auVar69._12_4_ = auVar21._12_4_;
      auVar41 = auVar64 & auVar82 | auVar69;
      auVar38 = packssdw(auVar21,auVar41);
      auVar38 = packssdw(auVar38 ^ auVar62,auVar38 ^ auVar62);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar8 + uVar3 + 0xe] = (char)((ulong)this >> (bVar2 + 0x90 & 0x38));
      }
      auVar38 = pshufhw(auVar38,auVar82,0x84);
      in_XMM2 = pshufhw(auVar41,auVar64,0x84);
      in_XMM2 = in_XMM2 & auVar38;
      auVar38 = pshufhw(auVar38,auVar69,0x84);
      auVar38 = (auVar38 | in_XMM2) ^ auVar62;
      auVar38 = packssdw(auVar38,auVar38);
      in_XMM1 = packsswb(auVar38,auVar38);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar8 + uVar3 + 0xf] = (char)((ulong)this >> (bVar2 + 0x88 & 0x38));
      }
      uVar8 = uVar8 + 0x10;
      lVar85 = lVar85 + -0x80;
    } while (((ulong)(uVar9 - uVar6) + 0xf & 0xfffffffffffffff0) != uVar8);
  }
  uVar8 = (ulong)(uint)local_68._0_4_;
  if (uVar8 < 0xd) {
    switchD_00569a20::default(local_68 + 4 + uVar8,0,0xc - uVar8);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  sVar106.value.pointer.ptr = (char *)local_68._8_8_;
  sVar106.value._0_8_ = local_68._0_8_;
  return (string_t)sVar106.value;
}

Assistant:

string_t HugeintCastToVarInt::Operation(uhugeint_t int_value, Vector &result) {
	uint32_t data_byte_size;
	if (int_value.upper != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size =
		    (int_value.upper == 0) ? 0 : static_cast<uint32_t>(std::ceil(std::log2(int_value.upper + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(int_value.upper) / 8.0));
	}

	uint32_t upper_byte_size = data_byte_size;
	if (data_byte_size > 0) {
		// If we have at least one byte on the upper side, the bottom side is complete
		data_byte_size += 8;
	} else {
		if (int_value.lower != NumericLimits<uint64_t>::Maximum()) {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower + 1) / 8.0));
		} else {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower) / 8.0));
		}
	}
	if (data_byte_size == 0) {
		data_byte_size++;
	}
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, false);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(upper_byte_size) - 1; i >= 0; --i) {
		writable_blob[wb_idx++] = static_cast<char>(int_value.upper >> i * 8 & 0xFF);
	}
	for (int i = static_cast<int>(data_byte_size - upper_byte_size) - 1; i >= 0; --i) {
		writable_blob[wb_idx++] = static_cast<char>(int_value.lower >> i * 8 & 0xFF);
	}
	blob.Finalize();
	return blob;
}